

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correlated_normal_dist.hpp
# Opt level: O0

void __thiscall
trng::correlated_normal_dist<double>::param_type::param_type<double_const*>
          (param_type *this,double *first,double *last)

{
  value_type *__x;
  size_type in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  double dVar1;
  size_type i;
  param_type *in_stack_00000020;
  double *in_stack_ffffffffffffffc8;
  double *in_stack_ffffffffffffffd0;
  vector<double,_std::allocator<double>_> *this_00;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x101f99);
  *(undefined8 *)(in_RDI + 0x18) = 0;
  __x = (value_type *)
        std::distance<double_const*>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  dVar1 = sqrt((double)(long)__x);
  *(long *)(in_RDI + 0x18) =
       (long)dVar1 | (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f;
  std::vector<double,_std::allocator<double>_>::reserve(in_RSI,in_RDX);
  for (this_00 = (vector<double,_std::allocator<double>_> *)0x0;
      this_00 < (vector<double,_std::allocator<double>_> *)
                (*(long *)(in_RDI + 0x18) * *(long *)(in_RDI + 0x18));
      this_00 = (vector<double,_std::allocator<double>_> *)
                ((long)&(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + 1)) {
    std::vector<double,_std::allocator<double>_>::push_back(this_00,__x);
  }
  Cholesky_factorization(in_stack_00000020);
  return;
}

Assistant:

explicit param_type(iter first, iter last) {
        d_ = static_cast<size_type>(
            trng::math::sqrt(static_cast<result_type>(std::distance(first, last))));
        H_.reserve(d_ * d_);
        for (size_type i{0}; i < d_ * d_; ++i, ++first)
          H_.push_back(*first);
        Cholesky_factorization();
      }